

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall TPZBlockDiagonal<float>::~TPZBlockDiagonal(TPZBlockDiagonal<float> *this)

{
  ~TPZBlockDiagonal(this,&VTT);
  operator_delete(this,0x80);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}